

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O3

size_t readto(io_buf *i,char **pointer,char terminal)

{
  char cVar1;
  int *piVar2;
  char *pcVar3;
  ssize_t sVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  size_t __n;
  
LAB_0022d48a:
  do {
    pcVar7 = i->head;
    *pointer = pcVar7;
    pcVar3 = (i->space)._end;
    if (pcVar7 < pcVar3) {
      cVar1 = *pcVar7;
      while (cVar1 != terminal) {
        pcVar7 = pcVar7 + 1;
        *pointer = pcVar7;
        pcVar3 = (i->space)._end;
        if (pcVar3 <= pcVar7) break;
        cVar1 = *pcVar7;
      }
    }
    if (pcVar7 != pcVar3) {
      lVar6 = (long)pcVar7 - (long)i->head;
      i->head = pcVar7 + 1;
      *pointer = *pointer + -lVar6;
      return lVar6 + 1;
    }
    if (pcVar7 == (i->space).end_array) {
      __n = (long)pcVar7 - (long)i->head;
      memmove((i->space)._begin,i->head,__n);
      pcVar7 = (i->space)._begin;
      i->head = pcVar7;
      pcVar7 = pcVar7 + __n;
      (i->space)._end = pcVar7;
      *pointer = pcVar7;
    }
    uVar5 = i->current;
    piVar2 = (i->files)._begin;
    uVar8 = (long)(i->files)._end - (long)piVar2 >> 2;
    if (uVar5 < uVar8) {
      sVar4 = io_buf::fill(i,piVar2[uVar5]);
      if (0 < sVar4) goto LAB_0022d48a;
      uVar5 = i->current;
      uVar8 = (long)(i->files)._end - (long)(i->files)._begin >> 2;
    }
    i->current = uVar5 + 1;
    if (uVar8 <= uVar5 + 1) {
      pcVar7 = *pointer;
      pcVar3 = i->head;
      i->head = pcVar7;
      *pointer = pcVar3;
      return (long)pcVar7 - (long)pcVar3;
    }
  } while( true );
}

Assistant:

size_t readto(io_buf& i, char*& pointer, char terminal)
{
  // Return a pointer to the bytes before the terminal.  Must be less than the buffer size.
  pointer = i.head;
  while (pointer < i.space.end() && *pointer != terminal) pointer++;
  if (pointer != i.space.end())
  {
    size_t n = pointer - i.head;
    i.head = pointer + 1;
    pointer -= n;
    return n + 1;
  }
  else
  {
    if (i.space.end() == i.space.end_array)
    {
      size_t left = i.space.end() - i.head;
      memmove(i.space.begin(), i.head, left);
      i.head = i.space.begin();
      i.space.end() = i.space.begin() + left;
      pointer = i.space.end();
    }
    if (i.current < i.files.size() && i.fill(i.files[i.current]) > 0)  // more bytes are read.
      return readto(i, pointer, terminal);
    else if (++i.current < i.files.size())  // no more bytes, so go to next file.
      return readto(i, pointer, terminal);
    else  // no more bytes to read, return everything we have.
    {
      size_t n = pointer - i.head;
      i.head = pointer;
      pointer -= n;
      return n;
    }
  }
}